

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::ZSobolSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,ZSobolSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::RandomizeStrategy_const&,int_const&,int_const&,int_const&,unsigned_long_const&,int_const&>
            (__return_storage_ptr__,
             "[ ZSobolSampler randomizeStrategy: %s log2SamplesPerPixel: %d  seed: %d nBase4Digits: %d mortonIndex: %d dimension: %d ]"
             ,&this->randomizeStrategy,&this->log2SamplesPerPixel,&this->seed,&this->nBase4Digits,
             &this->mortonIndex,&this->dimension);
  return __return_storage_ptr__;
}

Assistant:

std::string ZSobolSampler::ToString() const {
    return StringPrintf("[ ZSobolSampler randomizeStrategy: %s log2SamplesPerPixel: %d "
                        " seed: %d nBase4Digits: %d mortonIndex: %d dimension: %d ]",
                        randomizeStrategy, log2SamplesPerPixel, seed, nBase4Digits,
                        mortonIndex, dimension);
}